

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestCase *_testCase,string *_className,
                   string *_name,string *_descOrTags,SourceLineInfo *_lineInfo)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  ulong uVar4;
  size_type sVar5;
  int iVar6;
  iterator iVar7;
  bool bVar8;
  bool bVar9;
  string desc;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  TestCaseInfo info;
  string local_1b0;
  SourceLineInfo *local_190;
  string *local_188;
  key_type local_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  TestCaseInfo local_130;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  pcVar3 = (_descOrTags->_M_dataplus)._M_p;
  local_190 = _lineInfo;
  local_188 = _className;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,pcVar3,pcVar3 + _descOrTags->_M_string_length);
  paVar2 = &local_130.name.field_2;
  local_130.name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"./","");
  sVar5 = local_130.name._M_string_length;
  uVar4 = _name->_M_string_length;
  if ((uVar4 < local_130.name._M_string_length) ||
     (std::__cxx11::string::substr((ulong)&local_50,(ulong)_name),
     local_48 != local_130.name._M_string_length)) {
    bVar8 = false;
  }
  else if (local_48 == 0) {
    bVar8 = true;
  }
  else {
    iVar6 = bcmp(local_50,local_130.name._M_dataplus._M_p,local_48);
    bVar8 = iVar6 == 0;
  }
  if ((sVar5 <= uVar4) && (local_50 != local_40)) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_130.name._M_dataplus._M_p);
  }
  p_Var1 = &local_160._M_impl.super__Rb_tree_header;
  local_160._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_160._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_160._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_130.name._M_dataplus._M_p = (pointer)&PTR__TagExtracter_0016b448;
  local_130.name._M_string_length = (size_type)&local_160;
  local_130.name.field_2._8_8_ = 0;
  local_130.className._M_dataplus._M_p._0_1_ = 0;
  local_160._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_160._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_130.name.field_2._M_allocated_capacity = (size_type)&local_130.className;
  TagParser::parse((TagParser *)&local_130,&local_1b0);
  std::__cxx11::string::_M_assign((string *)&local_1b0);
  local_130.name._M_dataplus._M_p = (pointer)&PTR__TagExtracter_0016b448;
  if ((string *)local_130.name.field_2._M_allocated_capacity != &local_130.className) {
    operator_delete((void *)local_130.name.field_2._M_allocated_capacity);
  }
  local_130.name._M_dataplus._M_p = (pointer)&local_130.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"hide","");
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_160,&local_130.name);
  bVar9 = true;
  if ((_Rb_tree_header *)iVar7._M_node == p_Var1) {
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,".","");
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&local_160,&local_180);
    bVar9 = (_Rb_tree_header *)iVar7._M_node != p_Var1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.name._M_dataplus._M_p != &local_130.name.field_2) {
    operator_delete(local_130.name._M_dataplus._M_p);
  }
  TestCaseInfo::TestCaseInfo
            (&local_130,_name,local_188,&local_1b0,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_160,(bool)(bVar9 | bVar8),local_190);
  TestCase::TestCase(__return_storage_ptr__,_testCase,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.lineInfo.file._M_dataplus._M_p != &local_130.lineInfo.file.field_2) {
    operator_delete(local_130.lineInfo.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.tagsAsString._M_dataplus._M_p != &local_130.tagsAsString.field_2) {
    operator_delete(local_130.tagsAsString._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_130.tags._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.description._M_dataplus._M_p != &local_130.description.field_2) {
    operator_delete(local_130.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_130.className._M_dataplus._M_p._1_7_,
                  local_130.className._M_dataplus._M_p._0_1_) != &local_130.className.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_130.className._M_dataplus._M_p._1_7_,
                             local_130.className._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.name._M_dataplus._M_p != &local_130.name.field_2) {
    operator_delete(local_130.name._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

TestCase makeTestCase(  ITestCase* _testCase,
                            std::string const& _className,
                            std::string const& _name,
                            std::string const& _descOrTags,
                            SourceLineInfo const& _lineInfo )
    {
        std::string desc = _descOrTags;
        bool isHidden( startsWith( _name, "./" ) );
        std::set<std::string> tags;
        TagExtracter( tags ).parse( desc );
        if( tags.find( "hide" ) != tags.end() || tags.find( "." ) != tags.end() )
            isHidden = true;

        TestCaseInfo info( _name, _className, desc, tags, isHidden, _lineInfo );
        return TestCase( _testCase, info );
    }